

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Vec_Int_t * Gia_MiniAigProcessFile(void)

{
  int Entry;
  uint uVar1;
  Vec_Int_t *p;
  FILE *__stream;
  char *pcVar2;
  char local_418 [3];
  char acStack_415 [5];
  char Buffer [1000];
  char *pToken;
  int nLinesAll;
  int nLines;
  FILE *pFile;
  char *pFileName;
  Vec_Int_t *vTriples;
  
  p = Vec_IntAlloc(100);
  __stream = fopen("test.txt","rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open the file.\n");
  }
  else {
    pToken._4_4_ = 0;
    pToken._0_4_ = 0;
    while (pcVar2 = fgets(local_418,1000,__stream), pcVar2 != (char *)0x0) {
      pToken._0_4_ = (uint)pToken + 1;
      if (local_418[0] == '#') {
        pToken._4_4_ = pToken._4_4_ + 1;
        Buffer._992_8_ = strtok(acStack_415," \r\n\r+=");
        while (Buffer._992_8_ != 0) {
          Entry = atoi((char *)Buffer._992_8_);
          Vec_IntPush(p,Entry);
          Buffer._992_8_ = strtok((char *)0x0," \r\n\r+=");
        }
      }
    }
    fclose(__stream);
    printf("Collected %d (out of %d) lines.\n",(ulong)pToken._4_4_,(ulong)(uint)pToken);
    uVar1 = Vec_IntSize(p);
    printf("Entries = %d\n",(ulong)uVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_MiniAigProcessFile()
{
    Vec_Int_t * vTriples = Vec_IntAlloc( 100 );
    char * pFileName = "test.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
        printf( "Cannot open the file.\n" );
    else
    {
        int nLines = 0, nLinesAll = 0;
        char * pToken;
        char Buffer[1000];
        while ( fgets( Buffer, 1000, pFile ) != NULL )
        {
            nLinesAll++;
            if ( Buffer[0] != '#' )
                continue;
            //printf( "%s", Buffer );
            nLines++;
            pToken = strtok( Buffer+3, " \r\n\r+=" );
            while ( pToken )
            {
                Vec_IntPush( vTriples, atoi(pToken) );
                pToken = strtok( NULL, " \r\n\r+=" );
            }
        }
        fclose( pFile );
        printf( "Collected %d (out of %d) lines.\n", nLines, nLinesAll );
        printf( "Entries = %d\n", Vec_IntSize(vTriples) );
    }
    return vTriples;
}